

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O2

void aom_highbd_dc_predictor_32x16_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  uint16_t *puVar1;
  int iVar2;
  bool bVar3;
  uint extraout_XMM0_Da;
  int extraout_XMM0_Da_00;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  
  dc_sum_16(left);
  dc_sum_32(above);
  auVar5 = ZEXT416(((extraout_XMM0_Da & 0xffff) + extraout_XMM0_Da_00 + 0x18) / 0x30);
  auVar5 = pshuflw(auVar5,auVar5,0);
  uVar4 = auVar5._0_4_;
  iVar2 = 4;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    *(undefined4 *)dst = uVar4;
    *(undefined4 *)(dst + 2) = uVar4;
    *(undefined4 *)(dst + 4) = uVar4;
    *(undefined4 *)(dst + 6) = uVar4;
    *(undefined4 *)(dst + 8) = uVar4;
    *(undefined4 *)(dst + 10) = uVar4;
    *(undefined4 *)(dst + 0xc) = uVar4;
    *(undefined4 *)(dst + 0xe) = uVar4;
    *(undefined4 *)(dst + 0x10) = uVar4;
    *(undefined4 *)(dst + 0x12) = uVar4;
    *(undefined4 *)(dst + 0x14) = uVar4;
    *(undefined4 *)(dst + 0x16) = uVar4;
    *(undefined4 *)(dst + 0x18) = uVar4;
    *(undefined4 *)(dst + 0x1a) = uVar4;
    *(undefined4 *)(dst + 0x1c) = uVar4;
    *(undefined4 *)(dst + 0x1e) = uVar4;
    puVar1 = dst + stride;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride + 8;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride + 0x10;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride + 0x18;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride * 2;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride * 2 + 8;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride * 2 + 0x10;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride * 2 + 0x18;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride * 3;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride * 3 + 8;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride * 3 + 0x10;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride * 3 + 0x18;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    dst = dst + stride * 4;
  }
  return;
}

Assistant:

void aom_highbd_dc_predictor_32x16_sse2(uint16_t *dst, ptrdiff_t stride,
                                        const uint16_t *above,
                                        const uint16_t *left, int bd) {
  (void)bd;
  __m128i sum_left = dc_sum_16(left);
  __m128i sum_above = dc_sum_32(above);
  const __m128i zero = _mm_setzero_si128();
  sum_left = _mm_unpacklo_epi16(sum_left, zero);
  const __m128i sum = _mm_add_epi32(sum_left, sum_above);
  uint32_t sum32 = (uint32_t)_mm_cvtsi128_si32(sum);
  sum32 += 24;
  sum32 /= 48;
  const __m128i row = _mm_set1_epi16((int16_t)sum32);
  int i;
  for (i = 0; i < 4; ++i) {
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    _mm_store_si128((__m128i *)(dst + 16), row);
    _mm_store_si128((__m128i *)(dst + 24), row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    _mm_store_si128((__m128i *)(dst + 16), row);
    _mm_store_si128((__m128i *)(dst + 24), row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    _mm_store_si128((__m128i *)(dst + 16), row);
    _mm_store_si128((__m128i *)(dst + 24), row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    _mm_store_si128((__m128i *)(dst + 16), row);
    _mm_store_si128((__m128i *)(dst + 24), row);
    dst += stride;
  }
}